

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crossover.cc
# Opt level: O1

void __thiscall
ipx::Crossover::PushAll
          (Crossover *this,Basis *basis,Vector *x,Vector *y,Vector *z,double *weights,Info *info)

{
  double dVar1;
  double dVar2;
  int iVar3;
  Crossover *pCVar4;
  ostream *poVar5;
  fmtflags fVar6;
  Vector *pVVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  Int j;
  vector<int,_std::allocator<int>_> dual_superbasics;
  vector<int,_std::allocator<int>_> primal_superbasics;
  vector<int,_std::allocator<int>_> perm;
  stringstream h_logging_stream;
  string local_2a8;
  char local_281;
  Model *local_280;
  vector<int,_std::allocator<int>_> local_278;
  Vector *local_260;
  vector<int,_std::allocator<int>_> local_258;
  string local_240;
  string local_220;
  vector<int,_std::allocator<int>_> local_200;
  Vector *local_1e8;
  Crossover *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pVVar7 = z;
  local_260 = x;
  local_280 = Basis::model(basis);
  fVar6 = (fmtflags)pVVar7;
  Sortperm(&local_200,local_280->num_cols_ + local_280->num_rows_,weights,false);
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_2a8._M_string_length = 0;
  local_2a8.field_2._M_local_buf[0] = '\0';
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  Textline<char[35]>(&local_2a8,(char (*) [35])"Primal residual before push phase:");
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
  dVar10 = PrimalResidual(local_280,local_260);
  Format_abi_cxx11_(&local_220,(ipx *)0x0,dVar10,2,0x100,fVar6);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(char *)CONCAT71(local_220._M_dataplus._M_p._1_7_,
                                              local_220._M_dataplus._M_p._0_1_),
                      local_220._M_string_length);
  local_240._M_dataplus._M_p._0_1_ = 10;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_240,1);
  Textline<char[33]>(&local_240,(char (*) [33])"Dual residual before push phase:");
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(char *)CONCAT71(local_240._M_dataplus._M_p._1_7_,
                                              local_240._M_dataplus._M_p._0_1_),
                      local_240._M_string_length);
  dVar10 = DualResidual(local_280,y,z);
  Format_abi_cxx11_(&local_1d8,(ipx *)0x0,dVar10,2,0x100,fVar6);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_278,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_240._M_dataplus._M_p._1_7_,local_240._M_dataplus._M_p._0_1_) !=
      &local_240.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_240._M_dataplus._M_p._1_7_,local_240._M_dataplus._M_p._0_1_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_220._M_dataplus._M_p._1_7_,local_220._M_dataplus._M_p._0_1_) !=
      &local_220.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_220._M_dataplus._M_p._1_7_,local_220._M_dataplus._M_p._0_1_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  local_1e8 = y;
  local_1e0 = this;
  Control::hLog(this->control_,(stringstream *)local_1b8);
  local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  if (local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar8 = 0;
    do {
      iVar3 = local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8];
      local_2a8._M_dataplus._M_p._0_4_ = iVar3;
      if ((-1 < (basis->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar3]) &&
         ((z->_M_data[iVar3] != 0.0 || (NAN(z->_M_data[iVar3]))))) {
        if (local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_278,
                     (iterator)
                     local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_2a8);
        }
        else {
          *local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar3;
          local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 2));
  }
  Textline<char[32]>(&local_2a8,(char (*) [32])"Number of dual pushes required:");
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
  pCVar4 = local_1e0;
  pVVar7 = local_1e8;
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  local_220._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_220,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  Control::hLog(pCVar4->control_,(stringstream *)local_1b8);
  PushDual(pCVar4,basis,pVVar7,z,&local_278,local_260,info);
  pVVar7 = local_260;
  if ((info->super_ipx_info).status_crossover == 1) {
    local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (int *)0x0;
    local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    if ((long)local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      lVar9 = (long)local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
      do {
        iVar3 = local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar9 + -1];
        local_2a8._M_dataplus._M_p._0_4_ = iVar3;
        if ((basis->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar3] < 0) {
          dVar10 = pVVar7->_M_data[iVar3];
          dVar1 = (local_280->lb_)._M_data[iVar3];
          if ((dVar10 != dVar1) || (NAN(dVar10) || NAN(dVar1))) {
            dVar2 = (local_280->ub_)._M_data[iVar3];
            if ((dVar10 != dVar2) || (NAN(dVar10) || NAN(dVar2))) {
              if ((((dVar10 != 0.0) || (NAN(dVar10))) || (ABS(dVar1) != INFINITY)) ||
                 (ABS(dVar2) != INFINITY)) {
                if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&local_258,
                             (iterator)
                             local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,(int *)&local_2a8);
                }
                else {
                  *local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish = iVar3;
                  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
              }
            }
          }
        }
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    Textline<char[34]>(&local_2a8,(char (*) [34])"Number of primal pushes required:");
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
    pCVar4 = local_1e0;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    local_220._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_220,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
    Control::hLog(pCVar4->control_,(stringstream *)local_1b8);
    fVar6 = ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max);
    PushPrimal(pCVar4,basis,pVVar7,&local_258,(bool *)0x0,info);
    if ((info->super_ipx_info).status_crossover == 1) {
      poVar5 = Control::Debug(pCVar4->control_,1);
      Textline<char[34]>(&local_2a8,(char (*) [34])"Primal residual after push phase:");
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
      dVar10 = PrimalResidual(local_280,pVVar7);
      Format_abi_cxx11_(&local_220,(ipx *)0x0,dVar10,2,0x100,fVar6);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)CONCAT71(local_220._M_dataplus._M_p._1_7_,
                                                  local_220._M_dataplus._M_p._0_1_),
                          local_220._M_string_length);
      local_240._M_dataplus._M_p._0_1_ = 10;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_240,1);
      Textline<char[32]>(&local_240,(char (*) [32])"Dual residual after push phase:");
      pVVar7 = local_1e8;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)CONCAT71(local_240._M_dataplus._M_p._1_7_,
                                                  local_240._M_dataplus._M_p._0_1_),
                          local_240._M_string_length);
      dVar10 = DualResidual(local_280,pVVar7,z);
      Format_abi_cxx11_(&local_1d8,(ipx *)0x0,dVar10,2,0x100,fVar6);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      local_281 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_281,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_240._M_dataplus._M_p._1_7_,local_240._M_dataplus._M_p._0_1_) !=
          &local_240.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_240._M_dataplus._M_p._1_7_,local_240._M_dataplus._M_p._0_1_))
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_220._M_dataplus._M_p._1_7_,local_220._M_dataplus._M_p._0_1_) !=
          &local_220.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_220._M_dataplus._M_p._1_7_,local_220._M_dataplus._M_p._0_1_))
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p);
      }
      (info->super_ipx_info).status_crossover = 1;
    }
    if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  if (local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Crossover::PushAll(Basis* basis, Vector& x, Vector& y, Vector& z,
                        const double* weights, Info* info) {
    const Model& model = basis->model();
    const Int m = model.rows();
    const Int n = model.cols();
    const Vector& lb = model.lb();
    const Vector& ub = model.ub();
    std::vector<Int> perm = Sortperm(n+m, weights, false);

    std::stringstream h_logging_stream;
    h_logging_stream.str(std::string());
    h_logging_stream
      << Textline("Primal residual before push phase:")
      << sci2(PrimalResidual(model, x)) << '\n'
      << Textline("Dual residual before push phase:")
      << sci2(DualResidual(model, y, z)) << '\n';
    control_.hLog(h_logging_stream);

    // Run dual push phase.
    std::vector<Int> dual_superbasics;
    for (size_t p = 0; p < perm.size(); p++) {
        Int j = perm[p];
        if (basis->IsBasic(j) && z[j] != 0.0)
            dual_superbasics.push_back(j);
    }
    h_logging_stream
        << Textline("Number of dual pushes required:")
        << dual_superbasics.size() << '\n';
	control_.hLog(h_logging_stream);
    PushDual(basis, y, z, dual_superbasics, x, info);
    assert(DualInfeasibility(model, x, z) == 0.0);
    if (info->status_crossover != IPX_STATUS_optimal)
        return;

    // Run primal push phase. Because z[j]==0 for all basic variables, none of
    // the primal variables is fixed at its bound.
    std::vector<Int> primal_superbasics;
    for (size_t p = perm.size(); p > 0; p--) {
        Int j = perm[p - 1];
        if (basis->IsNonbasic(j) && x[j] != lb[j] && x[j] != ub[j] &&
            !(std::isinf(lb[j]) && std::isinf(ub[j]) && x[j] == 0.0))
            primal_superbasics.push_back(j);
    }
    h_logging_stream
        << Textline("Number of primal pushes required:")
        << primal_superbasics.size() << '\n';
	control_.hLog(h_logging_stream);
    PushPrimal(basis, x, primal_superbasics, nullptr, info);
    assert(PrimalInfeasibility(model, x) == 0.0);
    if (info->status_crossover != IPX_STATUS_optimal)
        return;

    control_.Debug()
        << Textline("Primal residual after push phase:")
        << sci2(PrimalResidual(model, x)) << '\n'
        << Textline("Dual residual after push phase:")
        << sci2(DualResidual(model, y, z)) << '\n';
    info->status_crossover = IPX_STATUS_optimal;
}